

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O1

void __thiscall
CRollingBloomFilter::insert(CRollingBloomFilter *this,Span<const_unsigned_char> vKey)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->nEntriesThisGeneration == this->nEntriesPerGeneration) {
    uVar4 = this->nGeneration + 1;
    uVar7 = 1;
    if (uVar4 != 4) {
      uVar7 = uVar4;
    }
    puVar2 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->nEntriesThisGeneration = 0;
    this->nGeneration = uVar7;
    lVar5 = (long)puVar2 - (long)puVar3;
    if (lVar5 != 0) {
      lVar9 = 1;
      do {
        uVar10 = puVar3[lVar9] ^ (long)-((int)uVar7 >> 1) | puVar3[lVar9 + -1] ^ -(ulong)(uVar7 & 1)
        ;
        puVar3[lVar9 + -1] = puVar3[lVar9 + -1] & uVar10;
        puVar3[lVar9] = uVar10 & puVar3[lVar9];
        iVar6 = (int)lVar9;
        lVar9 = lVar9 + 2;
      } while ((ulong)(iVar6 + 1) < (ulong)(lVar5 >> 3));
    }
  }
  this->nEntriesThisGeneration = this->nEntriesThisGeneration + 1;
  if (0 < this->nHashFuncs) {
    iVar6 = 0;
    iVar11 = 0;
    do {
      uVar4 = MurmurHash3(this->nTweak + iVar6,vKey);
      puVar2 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((ulong)((long)(this->data).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 3 &
               0xffffffff) * (ulong)uVar4 >> 0x1d;
      uVar8 = uVar10 & 0xfffffffffffffff0;
      uVar7 = this->nGeneration;
      *(ulong *)((long)puVar2 + uVar8) =
           (ulong)(uVar7 & 1) << ((byte)uVar4 & 0x3f) |
           *(ulong *)((long)puVar2 + uVar8) & ~(1L << ((ulong)uVar4 & 0x3f));
      uVar10 = uVar10 & 0xfffffffffffffff8 | 8;
      *(ulong *)((long)puVar2 + uVar10) =
           (long)((int)uVar7 >> 1) << ((byte)uVar4 & 0x3f) |
           *(ulong *)((long)puVar2 + uVar10) & ~(1L << ((ulong)uVar4 & 0x3f));
      iVar11 = iVar11 + 1;
      iVar6 = iVar6 + -0x45b386b;
    } while (iVar11 < this->nHashFuncs);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRollingBloomFilter::insert(Span<const unsigned char> vKey)
{
    if (nEntriesThisGeneration == nEntriesPerGeneration) {
        nEntriesThisGeneration = 0;
        nGeneration++;
        if (nGeneration == 4) {
            nGeneration = 1;
        }
        uint64_t nGenerationMask1 = 0 - (uint64_t)(nGeneration & 1);
        uint64_t nGenerationMask2 = 0 - (uint64_t)(nGeneration >> 1);
        /* Wipe old entries that used this generation number. */
        for (uint32_t p = 0; p < data.size(); p += 2) {
            uint64_t p1 = data[p], p2 = data[p + 1];
            uint64_t mask = (p1 ^ nGenerationMask1) | (p2 ^ nGenerationMask2);
            data[p] = p1 & mask;
            data[p + 1] = p2 & mask;
        }
    }
    nEntriesThisGeneration++;

    for (int n = 0; n < nHashFuncs; n++) {
        uint32_t h = RollingBloomHash(n, nTweak, vKey);
        int bit = h & 0x3F;
        /* FastMod works with the upper bits of h, so it is safe to ignore that the lower bits of h are already used for bit. */
        uint32_t pos = FastRange32(h, data.size());
        /* The lowest bit of pos is ignored, and set to zero for the first bit, and to one for the second. */
        data[pos & ~1U] = (data[pos & ~1U] & ~(uint64_t{1} << bit)) | (uint64_t(nGeneration & 1)) << bit;
        data[pos | 1] = (data[pos | 1] & ~(uint64_t{1} << bit)) | (uint64_t(nGeneration >> 1)) << bit;
    }
}